

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
::SetProto3PrimitiveRepeatedFields<proto3_arena_unittest::TestAllTypes>
          (Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
           *this,TestAllTypes *message)

{
  TestAllTypes *message_local;
  Proto3PrimitiveRepeatedWireFormatTest<void_(proto3_arena_unittest::TestAllTypes,_proto3_arena_unittest::TestUnpackedTypes)>
  *this_local;
  
  proto3_arena_unittest::TestAllTypes::add_repeated_int32(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_int64(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_uint32(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_uint64(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_sint32(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_sint64(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_fixed32(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_fixed64(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_sfixed32(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_sfixed64(message,1);
  proto3_arena_unittest::TestAllTypes::add_repeated_float(message,1.0);
  proto3_arena_unittest::TestAllTypes::add_repeated_double(message,1.0);
  proto3_arena_unittest::TestAllTypes::add_repeated_bool(message,true);
  proto3_arena_unittest::TestAllTypes::add_repeated_nested_enum(message,TestAllTypes_NestedEnum_FOO)
  ;
  return;
}

Assistant:

void SetProto3PrimitiveRepeatedFields(Proto* message) {
    message->add_repeated_int32(1);
    message->add_repeated_int64(1);
    message->add_repeated_uint32(1);
    message->add_repeated_uint64(1);
    message->add_repeated_sint32(1);
    message->add_repeated_sint64(1);
    message->add_repeated_fixed32(1);
    message->add_repeated_fixed64(1);
    message->add_repeated_sfixed32(1);
    message->add_repeated_sfixed64(1);
    message->add_repeated_float(1.0);
    message->add_repeated_double(1.0);
    message->add_repeated_bool(true);
    message->add_repeated_nested_enum(TestAllTypes::FOO);
  }